

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  bool bVar1;
  CodedInputStream *in_stack_000000d8;
  undefined1 in_stack_000000e0 [16];
  Message *in_stack_ffffffffffffffe0;
  
  Message::GetReflection(in_stack_ffffffffffffffe0);
  bVar1 = ParseMessageSetItemImpl<google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem(google::protobuf::io::CodedInputStream*,google::protobuf::Message*)::MSReflective>
                    (in_stack_000000d8,(MSReflective)in_stack_000000e0);
  return bVar1;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, NULL);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}